

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O1

void __thiscall CircBufTest::test3(CircBufTest *this)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  int iVar4;
  int i;
  int i_2;
  int iVar5;
  ulong uVar6;
  uint8_t dumpBuf [128];
  uint8_t buf [128];
  uint8_t trashBuf [128];
  CircularBuffer bigBuf;
  CircularBuffer tinyBuf;
  undefined1 local_388 [12];
  int local_37c;
  byte local_378 [192];
  undefined1 auStack_2b8 [64];
  undefined1 local_278 [136];
  CircularBuffer local_1f0 [224];
  CircularBuffer local_110 [224];
  
  JetHead::CircularBuffer::CircularBuffer(local_110,1);
  JetHead::CircularBuffer::CircularBuffer(local_1f0,0x40);
  lVar2 = 0;
  do {
    local_378[lVar2 + 0x80] = (byte)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  lVar2 = 0;
  do {
    auStack_2b8[lVar2] = (char)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  iVar5 = 1;
  do {
    rand();
    local_37c = iVar5;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,(int)local_378 + 0x80);
    JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378);
    JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_278);
    iVar5 = 0;
    do {
      iVar1 = rand();
      iVar4 = 0x80 - iVar5;
      if (iVar1 % 5 + iVar5 < 0x81) {
        iVar4 = iVar1 % 5;
      }
      JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,(int)local_378 + 0x80 + iVar5);
      iVar5 = iVar4 + iVar5;
    } while (iVar5 < 0x80);
    JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378);
    JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_278);
    lVar2 = 0;
    do {
      if (local_378[lVar2 + 0x80] != local_378[lVar2]) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"dumpBuf: ",9);
        plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cerr,(uint)local_378[lVar2]);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x227,"Random start smallish write_overflow test failed.");
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    iVar5 = local_37c + 1;
  } while (iVar5 != 0x80);
  iVar5 = 1;
  do {
    rand();
    local_37c = iVar5;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,(int)local_378 + 0x80);
    JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378);
    JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_278);
    iVar5 = 0;
    do {
      iVar1 = rand();
      iVar4 = 0x80 - iVar5;
      if (iVar1 % 0x32 + iVar5 < 0x81) {
        iVar4 = iVar1 % 0x32;
      }
      JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,(int)local_378 + 0x80 + iVar5);
      iVar5 = iVar4 + iVar5;
    } while (iVar5 < 0x80);
    JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378);
    JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_278);
    lVar2 = 0;
    do {
      if (local_378[lVar2 + 0x80] != local_378[lVar2]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x24e," Random start bigish write_overflow test failed.");
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    iVar5 = local_37c + 1;
  } while (iVar5 != 0x80);
  iVar5 = 1;
  do {
    iVar4 = (int)local_378 + 0x80;
    rand();
    local_37c = iVar5;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,iVar4);
    JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378);
    JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_278);
    JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,iVar4);
    local_378[0x70] = 0;
    local_378[0x71] = 0;
    local_378[0x72] = 0;
    local_378[0x73] = 0;
    local_378[0x74] = 0;
    local_378[0x75] = 0;
    local_378[0x76] = 0;
    local_378[0x77] = 0;
    local_378[0x78] = 0;
    local_378[0x79] = 0;
    local_378[0x7a] = 0;
    local_378[0x7b] = 0;
    local_378[0x7c] = 0;
    local_378[0x7d] = 0;
    local_378[0x7e] = 0;
    local_378[0x7f] = 0;
    local_378[0x60] = 0;
    local_378[0x61] = 0;
    local_378[0x62] = 0;
    local_378[99] = 0;
    local_378[100] = 0;
    local_378[0x65] = 0;
    local_378[0x66] = 0;
    local_378[0x67] = 0;
    local_378[0x68] = 0;
    local_378[0x69] = 0;
    local_378[0x6a] = 0;
    local_378[0x6b] = 0;
    local_378[0x6c] = 0;
    local_378[0x6d] = 0;
    local_378[0x6e] = 0;
    local_378[0x6f] = 0;
    local_378[0x50] = 0;
    local_378[0x51] = 0;
    local_378[0x52] = 0;
    local_378[0x53] = 0;
    local_378[0x54] = 0;
    local_378[0x55] = 0;
    local_378[0x56] = 0;
    local_378[0x57] = 0;
    local_378[0x58] = 0;
    local_378[0x59] = 0;
    local_378[0x5a] = 0;
    local_378[0x5b] = 0;
    local_378[0x5c] = 0;
    local_378[0x5d] = 0;
    local_378[0x5e] = 0;
    local_378[0x5f] = 0;
    local_378[0x40] = 0;
    local_378[0x41] = 0;
    local_378[0x42] = 0;
    local_378[0x43] = 0;
    local_378[0x44] = 0;
    local_378[0x45] = 0;
    local_378[0x46] = 0;
    local_378[0x47] = 0;
    local_378[0x48] = 0;
    local_378[0x49] = 0;
    local_378[0x4a] = 0;
    local_378[0x4b] = 0;
    local_378[0x4c] = 0;
    local_378[0x4d] = 0;
    local_378[0x4e] = 0;
    local_378[0x4f] = 0;
    local_378[0x30] = 0;
    local_378[0x31] = 0;
    local_378[0x32] = 0;
    local_378[0x33] = 0;
    local_378[0x34] = 0;
    local_378[0x35] = 0;
    local_378[0x36] = 0;
    local_378[0x37] = 0;
    local_378[0x38] = 0;
    local_378[0x39] = 0;
    local_378[0x3a] = 0;
    local_378[0x3b] = 0;
    local_378[0x3c] = 0;
    local_378[0x3d] = 0;
    local_378[0x3e] = 0;
    local_378[0x3f] = 0;
    local_378[0x20] = 0;
    local_378[0x21] = 0;
    local_378[0x22] = 0;
    local_378[0x23] = 0;
    local_378[0x24] = 0;
    local_378[0x25] = 0;
    local_378[0x26] = 0;
    local_378[0x27] = 0;
    local_378[0x28] = 0;
    local_378[0x29] = 0;
    local_378[0x2a] = 0;
    local_378[0x2b] = 0;
    local_378[0x2c] = 0;
    local_378[0x2d] = 0;
    local_378[0x2e] = 0;
    local_378[0x2f] = 0;
    local_378[0x10] = 0;
    local_378[0x11] = 0;
    local_378[0x12] = 0;
    local_378[0x13] = 0;
    local_378[0x14] = 0;
    local_378[0x15] = 0;
    local_378[0x16] = 0;
    local_378[0x17] = 0;
    local_378[0x18] = 0;
    local_378[0x19] = 0;
    local_378[0x1a] = 0;
    local_378[0x1b] = 0;
    local_378[0x1c] = 0;
    local_378[0x1d] = 0;
    local_378[0x1e] = 0;
    local_378[0x1f] = 0;
    local_378[0] = 0;
    local_378[1] = 0;
    local_378[2] = 0;
    local_378[3] = 0;
    local_378[4] = 0;
    local_378[5] = 0;
    local_378[6] = 0;
    local_378[7] = 0;
    local_378[8] = 0;
    local_378[9] = 0;
    local_378[10] = 0;
    local_378[0xb] = 0;
    local_378[0xc] = 0;
    local_378[0xd] = 0;
    local_378[0xe] = 0;
    local_378[0xf] = 0;
    iVar5 = 0;
    do {
      iVar1 = rand();
      iVar4 = 0x40 - iVar5;
      if (iVar1 % 5 + iVar5 < 0x41) {
        iVar4 = iVar1 % 5;
      }
      JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378 + iVar5);
      JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_388 + iVar5 + 0x110);
      iVar5 = iVar4 + iVar5;
    } while (iVar5 < 0x40);
    uVar6 = 0;
    do {
      if (uVar6 != local_378[uVar6]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x275,"smallish read failed.");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x40);
    iVar5 = local_37c + 1;
  } while (iVar5 != 0x80);
  iVar5 = 1;
  do {
    iVar4 = (int)local_378 + 0x80;
    rand();
    local_37c = iVar5;
    JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,iVar4);
    JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378);
    JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_278);
    JetHead::CircularBuffer::write_overflow((uchar *)local_1f0,iVar4);
    local_378[0x70] = 0;
    local_378[0x71] = 0;
    local_378[0x72] = 0;
    local_378[0x73] = 0;
    local_378[0x74] = 0;
    local_378[0x75] = 0;
    local_378[0x76] = 0;
    local_378[0x77] = 0;
    local_378[0x78] = 0;
    local_378[0x79] = 0;
    local_378[0x7a] = 0;
    local_378[0x7b] = 0;
    local_378[0x7c] = 0;
    local_378[0x7d] = 0;
    local_378[0x7e] = 0;
    local_378[0x7f] = 0;
    local_378[0x60] = 0;
    local_378[0x61] = 0;
    local_378[0x62] = 0;
    local_378[99] = 0;
    local_378[100] = 0;
    local_378[0x65] = 0;
    local_378[0x66] = 0;
    local_378[0x67] = 0;
    local_378[0x68] = 0;
    local_378[0x69] = 0;
    local_378[0x6a] = 0;
    local_378[0x6b] = 0;
    local_378[0x6c] = 0;
    local_378[0x6d] = 0;
    local_378[0x6e] = 0;
    local_378[0x6f] = 0;
    local_378[0x50] = 0;
    local_378[0x51] = 0;
    local_378[0x52] = 0;
    local_378[0x53] = 0;
    local_378[0x54] = 0;
    local_378[0x55] = 0;
    local_378[0x56] = 0;
    local_378[0x57] = 0;
    local_378[0x58] = 0;
    local_378[0x59] = 0;
    local_378[0x5a] = 0;
    local_378[0x5b] = 0;
    local_378[0x5c] = 0;
    local_378[0x5d] = 0;
    local_378[0x5e] = 0;
    local_378[0x5f] = 0;
    local_378[0x40] = 0;
    local_378[0x41] = 0;
    local_378[0x42] = 0;
    local_378[0x43] = 0;
    local_378[0x44] = 0;
    local_378[0x45] = 0;
    local_378[0x46] = 0;
    local_378[0x47] = 0;
    local_378[0x48] = 0;
    local_378[0x49] = 0;
    local_378[0x4a] = 0;
    local_378[0x4b] = 0;
    local_378[0x4c] = 0;
    local_378[0x4d] = 0;
    local_378[0x4e] = 0;
    local_378[0x4f] = 0;
    local_378[0x30] = 0;
    local_378[0x31] = 0;
    local_378[0x32] = 0;
    local_378[0x33] = 0;
    local_378[0x34] = 0;
    local_378[0x35] = 0;
    local_378[0x36] = 0;
    local_378[0x37] = 0;
    local_378[0x38] = 0;
    local_378[0x39] = 0;
    local_378[0x3a] = 0;
    local_378[0x3b] = 0;
    local_378[0x3c] = 0;
    local_378[0x3d] = 0;
    local_378[0x3e] = 0;
    local_378[0x3f] = 0;
    local_378[0x20] = 0;
    local_378[0x21] = 0;
    local_378[0x22] = 0;
    local_378[0x23] = 0;
    local_378[0x24] = 0;
    local_378[0x25] = 0;
    local_378[0x26] = 0;
    local_378[0x27] = 0;
    local_378[0x28] = 0;
    local_378[0x29] = 0;
    local_378[0x2a] = 0;
    local_378[0x2b] = 0;
    local_378[0x2c] = 0;
    local_378[0x2d] = 0;
    local_378[0x2e] = 0;
    local_378[0x2f] = 0;
    local_378[0x10] = 0;
    local_378[0x11] = 0;
    local_378[0x12] = 0;
    local_378[0x13] = 0;
    local_378[0x14] = 0;
    local_378[0x15] = 0;
    local_378[0x16] = 0;
    local_378[0x17] = 0;
    local_378[0x18] = 0;
    local_378[0x19] = 0;
    local_378[0x1a] = 0;
    local_378[0x1b] = 0;
    local_378[0x1c] = 0;
    local_378[0x1d] = 0;
    local_378[0x1e] = 0;
    local_378[0x1f] = 0;
    local_378[0] = 0;
    local_378[1] = 0;
    local_378[2] = 0;
    local_378[3] = 0;
    local_378[4] = 0;
    local_378[5] = 0;
    local_378[6] = 0;
    local_378[7] = 0;
    local_378[8] = 0;
    local_378[9] = 0;
    local_378[10] = 0;
    local_378[0xb] = 0;
    local_378[0xc] = 0;
    local_378[0xd] = 0;
    local_378[0xe] = 0;
    local_378[0xf] = 0;
    iVar5 = 0;
    do {
      iVar1 = rand();
      iVar4 = 0x40 - iVar5;
      if (iVar1 % 0x32 + iVar5 < 0x41) {
        iVar4 = iVar1 % 0x32;
      }
      JetHead::CircularBuffer::copy((uchar *)local_1f0,(int)local_378 + iVar5);
      JetHead::CircularBuffer::read((uchar *)local_1f0,(int)local_388 + iVar5 + 0x110);
      iVar5 = iVar4 + iVar5;
    } while (iVar5 < 0x40);
    uVar6 = 0;
    do {
      if (uVar6 != local_378[uVar6]) {
        TestCase::TestFailedInternal
                  (&this->super_TestCase,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
                   ,0x29f,"big reads failed.");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x40);
    iVar5 = local_37c + 1;
  } while (iVar5 != 0x80);
  JetHead::CircularBuffer::~CircularBuffer(local_1f0);
  JetHead::CircularBuffer::~CircularBuffer(local_110);
  return;
}

Assistant:

void CircBufTest::test3()
{

	// Like test2 but using bigBug instead of heapBuf,
	// write_overflow instead of write, and copy instead of read

	CircularBuffer tinyBuf = CircularBuffer(1);
	CircularBuffer bigBuf = CircularBuffer(BUFFER_SIZE / 2 );

	uint8_t buf[BUFFER_SIZE];
	uint8_t dumpBuf[BUFFER_SIZE];
	uint8_t trashBuf[BUFFER_SIZE];

	int count = 0;

	iota(buf, buf + (BUFFER_SIZE / 2), (uint8_t) 0);
	iota(buf + (BUFFER_SIZE / 2), buf + BUFFER_SIZE, (uint8_t) 0);


	// 1st Test: use one arg constructor to make a heapBuf, fill it
	// with a bunch of small writes, then make sure it worked.

	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		count = 0;
		while (count < BUFFER_SIZE)
		{

			int size = rand() % 5;

			if ( (count + size) > BUFFER_SIZE)
				size = BUFFER_SIZE - count;

			bigBuf.write_overflow(buf + count, size);
			count += size;
		}


		bigBuf.copy(dumpBuf, BUFFER_SIZE / 2 );
		bigBuf.read(trashBuf, BUFFER_SIZE / 2 );


		for( int i = 0; i < BUFFER_SIZE / 2; i++)
		{
			if ( buf[i] != dumpBuf[i] )
			{
				cerr << "dumpBuf: " << (int)dumpBuf[i] << endl;
				TestFailed("Random start smallish write_overflow test failed.") ;
			}
		}
	}

	// 2st Test: use one arg constructor to make a bigBuf, fill it
	// with a bunch of big writes, then make sure it worked.

	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		count = 0;
		while (count < BUFFER_SIZE)
		{

			int size = rand() % 50;

			if ( (count + size) > BUFFER_SIZE)
				size = BUFFER_SIZE - count;

			bigBuf.write_overflow(buf + count, size);
			count += size;
		}


		bigBuf.copy(dumpBuf, BUFFER_SIZE / 2 );
		bigBuf.read(trashBuf, BUFFER_SIZE / 2 );


		for( int i = 0; i < BUFFER_SIZE / 2; i++)
		{
			if ( buf[i] != dumpBuf[i] )
			{
				TestFailed(" Random start bigish write_overflow test failed.") ;
			}
		}
	}


	// 3nd Test: refill buffer, read small bits at a time.
	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));

		bigBuf.write_overflow(buf, BUFFER_SIZE );

		// Why use a for loop when you can do it the C++ way?
		fill(dumpBuf, dumpBuf + BUFFER_SIZE, 0);


		count = 0;
		while( count < BUFFER_SIZE / 2)
		{

			int size = rand() % 5;

			if ( (count + size) > BUFFER_SIZE / 2)
				size = ( BUFFER_SIZE / 2) - count;

			bigBuf.copy(dumpBuf + count , size);
			bigBuf.read(trashBuf + count , size);
			count += size;
		}

		for( int i = 0; i < BUFFER_SIZE / 2; i++ )
		{
			if( dumpBuf[i] != i)
				TestFailed("smallish read failed.");

		}
	}



	// 4th Test: refill buffer, big bits at a time.
	for (int j = 1; j < BUFFER_SIZE; j++)
	{
		int offset = rand() % j;

		// Just want to advance starting position.
		bigBuf.write_overflow(buf, offset );
		bigBuf.copy(dumpBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));
		bigBuf.read(trashBuf,(offset > BUFFER_SIZE / 2 ? BUFFER_SIZE / 2 : offset));


		bigBuf.write_overflow(buf, BUFFER_SIZE );

		// Why use a for loop when you can do it the C++ way?
		fill(dumpBuf, dumpBuf + BUFFER_SIZE, 0);


		count = 0;
		while( count < BUFFER_SIZE / 2)
		{

			int size = rand() % 50;

			if ( (count + size) > BUFFER_SIZE / 2)
				size = (BUFFER_SIZE / 2) - count;

			bigBuf.copy(dumpBuf + count , size);
			bigBuf.read(trashBuf + count , size);
			count += size;

		}

		for( int i = 0; i < BUFFER_SIZE / 2; i++ )
		{
			if( dumpBuf[i] != i )
				TestFailed("big reads failed.");

		}

	}

}